

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O3

void __thiscall VulkanUtilities::VulkanLogicalDevice::WaitIdle(VulkanLogicalDevice *this)

{
  VkResult VVar1;
  string msg;
  string local_28;
  
  VVar1 = (*vkDeviceWaitIdle)(this->m_VkDevice);
  if (VVar1 != VK_SUCCESS) {
    Diligent::FormatString<char[22]>(&local_28,(char (*) [22])"Failed to idle device");
    Diligent::DebugAssertionFailed
              (local_28._M_dataplus._M_p,"WaitIdle",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x9a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void VulkanLogicalDevice::WaitIdle() const
{
    VkResult err = vkDeviceWaitIdle(m_VkDevice);
    DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to idle device");
    (void)err;
}